

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexRenderOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_TILE_INFO *pGVar1;
  GMM_TILE_MODE GVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  ulong uVar4;
  anon_struct_8_45_9b07292e_for_Gpu aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint8_t uVar8;
  uint uVar9;
  GMM_STATUS GVar10;
  GMM_PLATFORM_INFO *pGVar11;
  undefined4 extraout_var;
  GMM_GFX_SIZE_T GVar12;
  uint uVar13;
  ulong uVar14;
  uint32_t local_3c;
  uint local_38;
  uint32_t OffsetZ;
  uint32_t OffsetX;
  
  local_38 = 0;
  OffsetZ = 0;
  local_3c = 0;
  GVar10 = GMM_ERROR;
  if (pReqInfo != (GMM_REQ_OFFSET_INFO *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    pGVar11 = GmmGetPlatformInfo(this->pGmmLibContext);
    GVar2 = pTexInfo->TileMode;
    uVar9 = (*this->_vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
    uVar14 = CONCAT44(extraout_var,uVar9);
    if (pGVar11->TileInfo[GVar2].LogicalSize == 0) {
      local_38 = uVar9 & 3;
      uVar14 = uVar14 & 0xfffffffffffffffc;
      if (pTexInfo->Pitch == 0) {
        OffsetZ = 0;
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pTexInfo->Pitch;
        auVar7 = ZEXT416(local_38);
        local_38 = SUB164(auVar7 % auVar6,0);
        OffsetZ = SUB164(auVar7 / auVar6,0);
      }
    }
    else {
      if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
         ((pTexInfo->Alignment).MipTailStartLod <= pReqInfo->MipLevel)) {
        uVar9 = (*this->_vptr_GmmTextureCalc[9])(this,pTexInfo);
        uVar14 = uVar14 - uVar9;
      }
      aVar3 = (pTexInfo->Flags).Info;
      if ((aVar3._0_4_ >> 0x1c & 1) == 0) {
        pGVar1 = pGVar11->TileInfo + GVar2;
        uVar4 = pTexInfo->Pitch;
        GVar12 = uVar4;
        if (uVar4 == 0) {
          GVar12 = pTexInfo->Size;
        }
        aVar5 = (pTexInfo->Flags).Gpu;
        uVar13 = 0;
        uVar9 = (uint)(uVar14 % GVar12);
        local_38 = (pGVar1->LogicalTileWidth >>
                   ((byte)((ulong)aVar3 >> 0x22) & (byte)((ulong)aVar5 >> 0x1d) & 1)) - 1 & uVar9;
        if (uVar4 != 0) {
          uVar13 = (uint)(uVar14 / uVar4);
          if (((ulong)aVar3 & 0x400000000) == 0 || (aVar5._0_4_ >> 0x1d & 1) == 0) {
            OffsetZ = pGVar1->LogicalTileDepth * pGVar1->LogicalTileHeight - 1 & uVar13;
            uVar13 = uVar13 - OffsetZ;
          }
          else {
            OffsetZ = pGVar1->LogicalTileHeight * pGVar1->LogicalTileDepth * 2 - 1 & uVar13 * 2;
            uVar13 = uVar13 * 2 - OffsetZ >> 1;
          }
        }
        uVar14 = (ulong)(((uVar9 - local_38) / pGVar1->LogicalTileWidth) * pGVar1->LogicalSize) +
                 uVar4 * uVar13;
        if ((((ulong)aVar3 & 0x106000000000) != 0) &&
           ((pTexInfo->Alignment).MipTailStartLod <= pReqInfo->MipLevel)) {
          uVar8 = GmmIsPlanar(pTexInfo->Format);
          if (uVar8 == '\0') {
            (*this->_vptr_GmmTextureCalc[10])
                      (this,pTexInfo,(ulong)pReqInfo->MipLevel,&local_38,&OffsetZ,&local_3c);
          }
        }
      }
      else {
        local_3c = 0;
        OffsetZ = 0;
        local_38 = 0;
      }
    }
    (pReqInfo->Render).field_0.Offset64 = uVar14;
    (pReqInfo->Render).XOffset = local_38;
    (pReqInfo->Render).YOffset = OffsetZ;
    (pReqInfo->Render).ZOffset = local_3c;
    GVar10 = GMM_SUCCESS;
  }
  return GVar10;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexRenderOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                      GMM_REQ_OFFSET_INFO *pReqInfo)
{

    const GMM_TILE_INFO *    pTileInfo         = NULL;
    GMM_GFX_SIZE_T           AddressOffset     = 0;
    GMM_GFX_SIZE_T           RenderAlignOffset = 0;
    uint32_t                 OffsetX           = 0;
    uint32_t                 OffsetY           = 0;
    uint32_t                 OffsetZ           = 0;
    const GMM_PLATFORM_INFO *pPlatform         = NULL;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    pPlatform     = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
    pTileInfo     = &pPlatform->TileInfo[pTexInfo->TileMode];
    AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);

    if(GMM_IS_TILED(*pTileInfo))
    {
        uint32_t       TileAlignedOffsetX = 0;
        uint32_t       TileAlignedOffsetY = 0;
        GMM_GFX_SIZE_T MipTailByteOffset  = 0;

        //--- Compute Tile-Aligned Offset, and Corresponding X/Y Offsets -------
        // Render/Tiled-Aligned offsets and corresponding X/Y offsets are used
        // to program the Surface Base Address and X/Y Offset fields of a
        // SURFACE_STATE. For a given subresource, the tiled-aligned offset
        // addresses the tile containing the base of the subresource; the X/Y
        // offsets then give the additional offsets into the tile of the
        // subresource base. (Though in SURFACE_STATE, X Offset is specified in
        // pixels, this function will return the X Offset in bytes. Y Offset is
        // in pixel rows.)

        if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod))
        {
            MipTailByteOffset = GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);

            // For MipTail, Offset is really with respect to start of MipTail,
            // so taking out individual Mipoffset within miptail region to get correct Tile aligned offset.
            AddressOffset -= MipTailByteOffset;
        }

        if(!pTexInfo->Flags.Info.RedecribedPlanes)
        {
            GMM_GFX_SIZE_T Pitch = pTexInfo->Pitch;
            if(!pTexInfo->Pitch)
            {
                // If no pitch exists, but the surface is still marked as tiled, then it is a 1D TileYf/Ys surface.
                // Technically no pitch exists for 1D surfaces, but we will fake it to make calculations work below.
                // Since 1D surfaces only have an X-dimension, this Pitch calculation is only used for OffsetX calculation.
                Pitch = pTexInfo->Size;
            }
	    
	    if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth / 2);
                OffsetX -= TileAlignedOffsetX;
            }
            else
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth);
                OffsetX -= TileAlignedOffsetX;
            }

            if(pTexInfo->Pitch)
            {
                if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    //Expt: YOffset ignore row-interleave -- verify both 2d/3d mips
                    OffsetY = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    OffsetY *= 2;
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * 2 * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                    TileAlignedOffsetY /= 2;
                }
                else
                {
                    OffsetY            = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                }
            }

            RenderAlignOffset =
            TileAlignedOffsetY * pTexInfo->Pitch +
            (TileAlignedOffsetX / pTileInfo->LogicalTileWidth) * pTileInfo->LogicalSize;

            // For Gen9+, Miptail Lods should be reported in a way that
            //      - Base Address equals tile-aligned "Miptail start address"
            //      - OffsetX equals to offset (in bytes) from "Miptail start Lod" to "current Lod" in geometric X direction
            //      - OffsetY and OffsetZ are their pixel distance from "Miptail start Lod" to "current Lod" in geometric Y, Z directions
            // Note: only Tile Yf and TileYs have Miptails and their Mips are always "tile aligned"

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod) &&
               // Planar surfaces do not support MIPs
               !GmmIsPlanar(pTexInfo->Format))
            {
                GetMipTailGeometryOffset(pTexInfo, pReqInfo->MipLevel, &OffsetX, &OffsetY, &OffsetZ);
            }
        }
        else
        {
            // Std swizzled and UV packed planes begin at tile-aligned
            // offsets and do not support MIPs, so no adjustment is needed
            RenderAlignOffset = AddressOffset;
            OffsetX = OffsetY = OffsetZ = 0;
        }
    }
    else
    {
        // Linear case make sure Render address is DWORD aligned.
        RenderAlignOffset = GFX_ALIGN_FLOOR(AddressOffset, GMM_BYTES(4));

        if(pTexInfo->Pitch)
        {
            OffsetX = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) % pTexInfo->Pitch);
            OffsetY = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) / pTexInfo->Pitch);
        }
        else
        {
            // One-dimensional textures (no height)
            OffsetX = GFX_ULONG_CAST(AddressOffset - RenderAlignOffset);
            OffsetY = 0;
        }
    }

    pReqInfo->Render.Offset64 = RenderAlignOffset;
    pReqInfo->Render.XOffset  = GFX_ULONG_CAST(OffsetX);
    pReqInfo->Render.YOffset  = GFX_ULONG_CAST(OffsetY);
    pReqInfo->Render.ZOffset  = GFX_ULONG_CAST(OffsetZ);

    return GMM_SUCCESS;
}